

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::FileMonitorTask::checkArguments
          (FileMonitorTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterOrThis)

{
  SourceRange range_00;
  bool bVar1;
  iterator iVar2;
  reference ppEVar3;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  ASTContext *in_RSI;
  SourceLocation in_RDI;
  Args *in_R9;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  MonitorVisitor visitor;
  Type *result;
  Expression *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff80;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffff88;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff90;
  MonitorVisitor local_58 [3];
  Expression *in_stack_ffffffffffffffc0;
  Type *local_8;
  
  range_00.endLoc = in_RCX;
  range_00.startLoc = in_RDI;
  local_8 = FileDisplayTask::checkArguments
                      ((FileDisplayTask *)in_RSI,in_RDX,in_R9,range_00,in_stack_ffffffffffffffc0);
  bVar1 = Type::isError((Type *)0x9bcc4b);
  if (!bVar1) {
    MonitorVisitor::MonitorVisitor(local_58,in_RSI);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
              (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88._M_current,
               in_stack_ffffffffffffff80);
    iVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                       in_stack_ffffffffffffff78);
    iVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                      (iVar2._M_current);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)iVar2._M_current,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff78), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)&stack0xffffffffffffff88);
      in_stack_ffffffffffffff78 = *ppEVar3;
      Expression::visit<slang::ast::builtins::MonitorVisitor&>
                ((Expression *)iVar2._M_current,(MonitorVisitor *)in_stack_ffffffffffffff78);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffff88);
    }
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = FileDisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args.subspan(1))
            arg->visit(visitor);

        return result;
    }